

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O3

DebugClient * __thiscall
PoolList<ProxyServer::DebugClient>::append<ProxyServer::DebugListener&,Server::Client&>
          (PoolList<ProxyServer::DebugClient> *this,DebugListener *a,Client *b)

{
  Item *pIVar1;
  Item *pIVar2;
  DebugClient *pDVar3;
  PoolList<ProxyServer::DebugClient> *pPVar4;
  
  pDVar3 = allocateFreeItem(this);
  (pDVar3->super_ICallback)._vptr_ICallback = (_func_int **)&PTR_onRead_00124ce8;
  pDVar3->_parent = a;
  pDVar3->_handle = b;
  pIVar1 = (this->_end).item;
  pIVar2 = this->freeItem;
  this->freeItem = pIVar2->prev;
  pPVar4 = (PoolList<ProxyServer::DebugClient> *)pIVar1->prev;
  pIVar2->prev = (Item *)pPVar4;
  if (pPVar4 == (PoolList<ProxyServer::DebugClient> *)0x0) {
    pPVar4 = this;
  }
  (pPVar4->_begin).item = pIVar2;
  pIVar2->next = pIVar1;
  pIVar1->prev = pIVar2;
  this->_size = this->_size + 1;
  return pDVar3;
}

Assistant:

T& append(A a, B b) {return linkFreeItem(new (allocateFreeItem()) T(a, b));}